

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_statistics.h
# Opt level: O2

float highwayhash::Median<float>(vector<float,_std::allocator<float>_> *samples)

{
  pointer pfVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  
  if ((samples->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start !=
      (samples->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::
    __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ();
    pfVar1 = (samples->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (long)(samples->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar1;
    uVar2 = (ulong)((long)uVar3 >> 2) >> 1;
    fVar4 = pfVar1[uVar2];
    if ((uVar3 & 4) == 0) {
      fVar4 = (fVar4 + pfVar1[uVar2 - 1]) * 0.5;
    }
    return fVar4;
  }
  __assert_fail("!samples->empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]highwayhash/highwayhash/robust_statistics.h"
                ,0x6e,"T highwayhash::Median(std::vector<T> *) [T = float]");
}

Assistant:

T Median(std::vector<T>* samples) {
  assert(!samples->empty());
  std::sort(samples->begin(), samples->end());
  const size_t half = samples->size() / 2;
  // Odd count: return middle
  if (samples->size() % 2) {
    return (*samples)[half];
  }
  // Even count: return average of middle two.
  return ((*samples)[half] + (*samples)[half - 1]) / 2;
}